

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

_Bool place_new_monster_one
                (chunk *c,loc_conflict grid,monster_race *race,_Bool sleep,
                monster_group_info group_info,uint8_t origin)

{
  undefined2 uVar1;
  _Bool _Var2;
  int16_t iVar3;
  uint32_t uVar4;
  wchar_t wVar5;
  int iVar6;
  monster *pmVar7;
  player_race *ppVar8;
  player_race *p_race;
  undefined1 auStack_238 [4];
  wchar_t val;
  monster monster_body;
  monster *mon;
  wchar_t i;
  _Bool sleep_local;
  monster_race *race_local;
  chunk *c_local;
  monster_group_info group_info_local;
  loc_conflict grid_local;
  
  group_info_local._0_8_ = group_info.player_race;
  c_local = group_info._0_8_;
  unique0x100007cd = grid;
  _Var2 = square_in_bounds(c,grid);
  if (!_Var2) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x70e,
                  "_Bool place_new_monster_one(struct chunk *, struct loc, struct monster_race *, _Bool, struct monster_group_info, uint8_t)"
                 );
  }
  if ((race != (monster_race *)0x0) && (race->name != (char *)0x0)) {
    pmVar7 = square_monster(c,stack0xffffffffffffffec);
    if (pmVar7 == (monster *)0x0) {
      _Var2 = loc_eq(player->grid,(loc)stack0xffffffffffffffec);
      if (_Var2) {
        grid_local.x._3_1_ = false;
      }
      else {
        _Var2 = flag_has_dbg(race->flags,0xc,0x4c,"race->flags","RF_HURT_LIGHT");
        if ((_Var2) && (_Var2 = is_daylight(), _Var2)) {
          grid_local.x._3_1_ = false;
        }
        else {
          _Var2 = square_is_monster_walkable(c,stack0xffffffffffffffec);
          if (_Var2) {
            _Var2 = square_ispassable(c,stack0xffffffffffffffec);
            if (!_Var2) {
              __assert_fail("square_ispassable(c, grid)",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                            ,0x71d,
                            "_Bool place_new_monster_one(struct chunk *, struct loc, struct monster_race *, _Bool, struct monster_group_info, uint8_t)"
                           );
            }
            _Var2 = square_iswarded(c,stack0xffffffffffffffec);
            if ((_Var2) || (_Var2 = square_isdecoyed(c,stack0xffffffffffffffec), _Var2)) {
              grid_local.x._3_1_ = false;
            }
            else {
              _Var2 = flag_has_dbg(race->flags,0xc,1,"race->flags","RF_UNIQUE");
              if ((_Var2) && ((int)(uint)race->max_num <= race->cur_num)) {
                grid_local.x._3_1_ = false;
              }
              else {
                _Var2 = flag_has_dbg(race->flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
                if ((_Var2) && (c->ghost->bones_selector != L'\0')) {
                  grid_local.x._3_1_ = false;
                }
                else {
                  _Var2 = flag_has_dbg(race->flags,0xc,0xc,"race->flags","RF_FORCE_DEPTH");
                  if ((_Var2) && (c->depth < race->level)) {
                    grid_local.x._3_1_ = false;
                  }
                  else {
                    add_to_monster_rating(c,race->level * race->level);
                    if (c->depth < race->level) {
                      _Var2 = flag_has_dbg(race->flags,0xc,1,"race->flags","RF_UNIQUE");
                      if (_Var2) {
                        if (((player->opts).opt[0x16] & 1U) != 0) {
                          msg("Deep unique (%s).",race->name);
                        }
                      }
                      else if (((player->opts).opt[0x16] & 1U) != 0) {
                        msg("Deep monster (%s).",race->name);
                      }
                      add_to_monster_rating(c,(race->level - c->depth) * race->level * race->level);
                    }
                    else {
                      _Var2 = flag_has_dbg(race->flags,0xc,1,"race->flags","RF_UNIQUE");
                      if ((_Var2) && (((player->opts).opt[0x16] & 1U) != 0)) {
                        msg("Unique (%s).");
                      }
                    }
                    monster_body._488_8_ = auStack_238;
                    memset((void *)monster_body._488_8_,0,0x1f0);
                    _Var2 = flag_has_dbg(race->flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
                    _i = race;
                    if (_Var2) {
                      _Var2 = prepare_ghost(c,race->ridx,(monster *)monster_body._488_8_,false);
                      if (!_Var2) {
                        return false;
                      }
                      _i = r_info + (int)(z_info->r_max - 1);
                    }
                    *(monster_race **)monster_body._488_8_ = _i;
                    if (sleep) {
                      if (_i->sleep == L'\0') {
                        _Var2 = is_night();
                        if ((_Var2) &&
                           (wVar5 = level_topography((int)player->place), wVar5 != L'\0')) {
                          *(short *)(monster_body._488_8_ + 0x30) =
                               *(short *)(monster_body._488_8_ + 0x30) + 0x14;
                        }
                      }
                      else {
                        wVar5 = _i->sleep;
                        uVar4 = Rand_div(wVar5 * 10);
                        *(short *)(monster_body._488_8_ + 0x30) =
                             (short)(wVar5 << 1) + (short)uVar4 + 1;
                      }
                    }
                    _Var2 = flag_has_dbg(_i->flags,0xc,1,"race->flags","RF_UNIQUE");
                    if (_Var2) {
                      *(short *)(monster_body._488_8_ + 0x2e) = (short)_i->avg_hp;
                    }
                    else {
                      wVar5 = mon_hp(_i,RANDOMISE);
                      *(short *)(monster_body._488_8_ + 0x2e) = (short)wVar5;
                      if (*(short *)(monster_body._488_8_ + 0x2e) < 1) {
                        uVar1 = 1;
                      }
                      else {
                        uVar1 = *(undefined2 *)(monster_body._488_8_ + 0x2e);
                      }
                      *(undefined2 *)(monster_body._488_8_ + 0x2e) = uVar1;
                    }
                    *(undefined2 *)(monster_body._488_8_ + 0x2c) =
                         *(undefined2 *)(monster_body._488_8_ + 0x2e);
                    *(char *)(monster_body._488_8_ + 0x44) = (char)_i->speed;
                    _Var2 = flag_has_dbg(_i->flags,0xc,1,"race->flags","RF_UNIQUE");
                    if (!_Var2) {
                      wVar5 = turn_energy(_i->speed);
                      iVar6 = wVar5 / 10;
                      if (iVar6 != 0) {
                        uVar4 = Rand_div(iVar6 * 2 + 1);
                        *(char *)(monster_body._488_8_ + 0x44) =
                             *(char *)(monster_body._488_8_ + 0x44) + ((char)uVar4 - (char)iVar6);
                      }
                    }
                    uVar4 = Rand_div(0x32);
                    *(char *)(monster_body._488_8_ + 0x45) = (char)uVar4;
                    _Var2 = flag_has_dbg(_i->flags,0xc,0xd,"race->flags","RF_FORCE_SLEEP");
                    if (_Var2) {
                      flag_on_dbg((bitflag *)(monster_body._488_8_ + 0x47),2,3,"mon->mflag",
                                  "MFLAG_NICE");
                    }
                    if (*(int *)(*(long *)monster_body._488_8_ + 0x48) != 0) {
                      player->upkeep->update = player->upkeep->update | 0xc0;
                    }
                    _Var2 = flag_has_dbg(_i->flags,0xc,0x16,"race->flags","RF_UNAWARE");
                    if (_Var2) {
                      flag_on_dbg((bitflag *)(monster_body._488_8_ + 0x47),2,7,"mon->mflag",
                                  "MFLAG_CAMOUFLAGE");
                    }
                    else {
                      flag_off((bitflag *)(monster_body._488_8_ + 0x47),2,7);
                    }
                    _Var2 = flag_has_dbg(_i->flags,0xc,8,"race->flags","RF_ATTR_RAND");
                    if (_Var2) {
                      uVar4 = Rand_div(0x1d);
                      *(char *)(monster_body._488_8_ + 0x60) = (char)uVar4 + '\x01';
                    }
                    *(undefined4 *)(monster_body._488_8_ + 0x1b8) = c_local._0_4_;
                    *(undefined4 *)(monster_body._488_8_ + 0x1bc) = c_local._4_4_;
                    *(undefined8 *)(monster_body._488_8_ + 0x1c0) = group_info_local._0_8_;
                    _Var2 = flag_has_dbg((bitflag *)(*(long *)monster_body._488_8_ + 0x5c),0xc,0x24,
                                         "mon->race->flags","RF_PLAYER");
                    if (_Var2) {
                      ppVar8 = monster_group_player_race(c,(monster *)monster_body._488_8_);
                      *(undefined4 *)(monster_body._488_8_ + 0x20) = 0xfffffffe;
                      monster_group_assign
                                (c,(monster *)monster_body._488_8_,(monster_group_info *)&c_local,
                                 false);
                      if (ppVar8 == (player_race *)0x0) {
                        ppVar8 = get_player_race();
                        *(player_race **)(monster_body._488_8_ + 0x10) = ppVar8;
                        set_monster_group_player_race(c,(monster *)monster_body._488_8_,ppVar8);
                      }
                      else {
                        *(player_race **)(monster_body._488_8_ + 0x10) = ppVar8;
                      }
                      _Var2 = mon_is_neutral(c,(monster *)monster_body._488_8_,
                                             stack0xffffffffffffffec);
                      if (_Var2) {
                        *(undefined4 *)(monster_body._488_8_ + 0x1a8) = 0;
                      }
                      else {
                        *(undefined4 *)(monster_body._488_8_ + 0x1a8) = 0xffffffff;
                      }
                    }
                    else {
                      *(undefined4 *)(monster_body._488_8_ + 0x1a8) = 0xffffffff;
                    }
                    _Var2 = flag_has_dbg(_i->flags,0xc,0x25,"race->flags","RF_TERRITORIAL");
                    if (_Var2) {
                      *(loc_conflict *)(monster_body._488_8_ + 0x1ac) = stack0xffffffffffffffec;
                    }
                    iVar3 = place_monster(c,stack0xffffffffffffffec,(monster *)monster_body._488_8_,
                                          origin);
                    if (iVar3 == 0) {
                      grid_local.x._3_1_ = false;
                    }
                    else {
                      grid_local.x._3_1_ = true;
                    }
                  }
                }
              }
            }
          }
          else {
            grid_local.x._3_1_ = false;
          }
        }
      }
    }
    else {
      grid_local.x._3_1_ = false;
    }
    return grid_local.x._3_1_;
  }
  __assert_fail("race && race->name",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                ,0x70f,
                "_Bool place_new_monster_one(struct chunk *, struct loc, struct monster_race *, _Bool, struct monster_group_info, uint8_t)"
               );
}

Assistant:

static bool place_new_monster_one(struct chunk *c, struct loc grid,
		struct monster_race *race, bool sleep,
		struct monster_group_info group_info,
		uint8_t origin)
{
	int i;
	struct monster *mon;
	struct monster monster_body;

	assert(square_in_bounds(c, grid));
	assert(race && race->name);

	/* Not where monsters already are */
	if (square_monster(c, grid)) return false;

	/* Not where the player already is */
	if (loc_eq(player->grid, grid)) return false;

	/* No light hating monsters in daytime */
	if (rf_has(race->flags, RF_HURT_LIGHT) && is_daylight()) return false;

	/* Prevent monsters from being placed where they cannot walk, but allow
	 * other feature types */
	if (!square_is_monster_walkable(c, grid)) return false;
	assert(square_ispassable(c, grid));

	/* No creation on glyphs */
	if (square_iswarded(c, grid) || square_isdecoyed(c, grid)) return false;

	/* "unique" monsters must be "unique" */
	if (rf_has(race->flags, RF_UNIQUE) && (race->cur_num >= race->max_num))
		return false;

	/* Only 1 player ghost at a time */
	if (rf_has(race->flags, RF_PLAYER_GHOST) && c->ghost->bones_selector)
		return false;

	/* Depth monsters may NOT be created out of depth */
	if (rf_has(race->flags, RF_FORCE_DEPTH) && c->depth < race->level)
		return false;

	/* Add to level feeling, note uniques for cheaters */
	add_to_monster_rating(c, race->level * race->level);

	/* Check out-of-depth-ness */
	if (race->level > c->depth) {
		if (rf_has(race->flags, RF_UNIQUE)) { /* OOD unique */
			if (OPT(player, cheat_hear))
				msg("Deep unique (%s).", race->name);
		} else { /* Normal monsters but OOD */
			if (OPT(player, cheat_hear))
				msg("Deep monster (%s).", race->name);
		}
		/* Boost rating by power per 10 levels OOD */
		add_to_monster_rating(c, (race->level - c->depth) * race->level
			* race->level);
	} else if (rf_has(race->flags, RF_UNIQUE) && OPT(player, cheat_hear)) {
		msg("Unique (%s).", race->name);
	}

	/* Get local monster */
	mon = &monster_body;

	/* Clean out the monster */
	memset(mon, 0, sizeof(struct monster));

	/* If the monster is a player ghost, perform various manipulations 
	 * on it, and forbid ghost creation if something goes wrong. */
	if (rf_has(race->flags, RF_PLAYER_GHOST)) {
		if (!prepare_ghost(c, race->ridx, mon, false)) return false;

		/* Point to the special "ghost slot" */
		race = &r_info[PLAYER_GHOST_RACE];
	}

	/* Save the race */
	mon->race = race;

	/* Enforce sleeping if needed */
	if (sleep) {
		if (race->sleep) {
			int val = race->sleep;
			mon->m_timed[MON_TMD_SLEEP] = ((val * 2) + randint1(val * 10));
		} else if (is_night() &&
				   (level_topography(player->place) != TOP_TOWN)) {
			mon->m_timed[MON_TMD_SLEEP] += 20;
		}
	}

	/* Uniques get a fixed amount of HP */
	if (rf_has(race->flags, RF_UNIQUE))
		mon->maxhp = race->avg_hp;
	else {
		mon->maxhp = mon_hp(race, RANDOMISE);
		mon->maxhp = MAX(mon->maxhp, 1);
	}

	/* And start out fully healthy */
	mon->hp = mon->maxhp;

	/* Extract the monster base speed */
	mon->mspeed = race->speed;

	/* Hack -- small racial variety */
	if (!rf_has(race->flags, RF_UNIQUE)) {
		/* Allow some small variation per monster */
		i = turn_energy(race->speed) / 10;
		if (i) mon->mspeed += rand_spread(0, i);
	}

	/* Give a random starting energy */
	mon->energy = (uint8_t)randint0(50);

	/* Force monster to wait for player */
	if (rf_has(race->flags, RF_FORCE_SLEEP))
		mflag_on(mon->mflag, MFLAG_NICE);

	/* Affect light? */
	if (mon->race->light != 0)
		player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

	/* Is this obviously a monster? (Mimics etc. aren't) */
	if (rf_has(race->flags, RF_UNAWARE))
		mflag_on(mon->mflag, MFLAG_CAMOUFLAGE);
	else
		mflag_off(mon->mflag, MFLAG_CAMOUFLAGE);

	/* Set the color if necessary */
	if (rf_has(race->flags, RF_ATTR_RAND))
		mon->attr = randint1(BASIC_COLORS - 1);

	/* Set the group info */
	mon->group_info[PRIMARY_GROUP].index = group_info.index;
	mon->group_info[PRIMARY_GROUP].role = group_info.role;
	mon->group_info[PRIMARY_GROUP].player_race = group_info.player_race;

	/* Set hostility, or possible neutrality for player race monsters */
	if (rf_has(mon->race->flags, RF_PLAYER)) {
		struct player_race *p_race = monster_group_player_race(c, mon);

		/* Give the monster the special index to indicate it needs updating */
		mon->midx = MIDX_FAKE;

		/* Assign the monster to its group */
		monster_group_assign(c, mon, &group_info, false);

		/* Set player race if needed */
		if (p_race) {
			/* Use the existing race */
			mon->player_race = p_race;
		} else {
			/* Pick a race and set the monster and group races to it */
			p_race = get_player_race();
			mon->player_race = p_race;
			set_monster_group_player_race(c, mon, p_race);
		}

		/* Set hostility */
		if (mon_is_neutral(c, mon, grid)) {
			mon->target.midx = 0;
		} else {
			mon->target.midx = -1;
		}
	} else {
		/* Set to target the player */
		mon->target.midx = -1;
	}

	/* Mark territorial monster's home */
	if (rf_has(race->flags, RF_TERRITORIAL)) {
		mon->home = grid;
	}

	/* Place the monster in the dungeon */
	if (!place_monster(c, grid, mon, origin))
		return (false);

	/* Success */
	return (true);
}